

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O0

bool __thiscall crnlib::data_stream::read_array(data_stream *this,vector<unsigned_char> *buf)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uchar *puVar4;
  vector<unsigned_char> *buf_local;
  data_stream *this_local;
  
  uVar1 = vector<unsigned_char>::size(buf);
  iVar2 = (*this->_vptr_data_stream[10])();
  if ((ulong)uVar1 < CONCAT44(extraout_var,iVar2)) {
    iVar2 = (*this->_vptr_data_stream[10])();
    if (0x40000000 < CONCAT44(extraout_var_00,iVar2)) {
      return false;
    }
    uVar1 = (*this->_vptr_data_stream[10])();
    vector<unsigned_char>::resize(buf,uVar1,false);
  }
  iVar2 = (*this->_vptr_data_stream[10])();
  if (CONCAT44(extraout_var_01,iVar2) == 0) {
    vector<unsigned_char>::resize(buf,0,false);
    this_local._7_1_ = true;
  }
  else {
    puVar4 = vector<unsigned_char>::operator[](buf,0);
    uVar1 = vector<unsigned_char>::size(buf);
    uVar1 = (*this->_vptr_data_stream[4])(this,puVar4,(ulong)uVar1);
    uVar3 = vector<unsigned_char>::size(buf);
    this_local._7_1_ = uVar1 == uVar3;
  }
  return this_local._7_1_;
}

Assistant:

bool data_stream::read_array(vector<uint8>& buf)
    {
        if (buf.size() < get_remaining())
        {
            if (get_remaining() > 1024U * 1024U * 1024U)
            {
                return false;
            }

            buf.resize((uint)get_remaining());
        }

        if (!get_remaining())
        {
            buf.resize(0);
            return true;
        }

        return read(&buf[0], buf.size()) == buf.size();
    }